

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::Multiply_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  Var pvVar6;
  JavascriptNumber *pJVar7;
  Type TVar8;
  double dVar9;
  Type TVar10;
  double dVar11;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00a9e1c1;
    *puVar4 = 0;
LAB_00a9dcb2:
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00a9e1c1;
      *puVar4 = 0;
    }
    TVar8 = ((pRVar5->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00a9e1c1;
LAB_00a9dd86:
      *puVar4 = 0;
    }
  }
  else {
    if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00a9e1c1;
      TVar8 = TypeIds_FirstNumberType;
      goto LAB_00a9dd86;
    }
    TVar8 = TypeIds_FirstNumberType;
    if ((((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) &&
       (TVar8 = TypeIds_Number, (ulong)aLeft >> 0x32 == 0)) goto LAB_00a9dcb2;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00a9e1c1;
    *puVar4 = 0;
LAB_00a9de97:
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00a9e1c1;
      *puVar4 = 0;
    }
    TVar10 = ((pRVar5->type).ptr)->typeId;
    if ((0x57 < (int)TVar10) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00a9e1c1;
LAB_00a9df63:
      *puVar4 = 0;
    }
  }
  else {
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00a9e1c1;
      TVar10 = TypeIds_FirstNumberType;
      goto LAB_00a9df63;
    }
    TVar10 = TypeIds_FirstNumberType;
    if ((((ulong)aRight & 0xffff000000000000) != 0x1000000000000) &&
       (TVar10 = TypeIds_Number, (ulong)aRight >> 0x32 == 0)) goto LAB_00a9de97;
  }
  if ((TVar8 == TypeIds_BigInt) || (TVar10 == TypeIds_BigInt)) {
    if (TVar10 != TVar8) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fff3,L"Multiply BigInt");
    }
    pvVar6 = JavascriptBigInt::Mul(aLeft,aRight);
    return pvVar6;
  }
  if ((ulong)aLeft >> 0x32 == 0) {
    if (aRight < (Var)0x4000000000000) {
      bVar2 = TaggedInt::IsPair(aLeft,aRight);
      if (bVar2) {
        pvVar6 = TaggedInt::MultiplyInPlace(aLeft,aRight,scriptContext,result);
        return pvVar6;
      }
LAB_00a9e199:
      dVar9 = Multiply_Helper(aLeft,aRight,scriptContext);
      pJVar7 = JavascriptNumber::InPlaceNew(dVar9,scriptContext,result);
      return pJVar7;
    }
    if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) goto LAB_00a9e199;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00a9e1c1;
      *puVar4 = 0;
    }
    dVar9 = (double)(int)aLeft;
  }
  else {
    if (aRight < (Var)0x4000000000000) {
      if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) goto LAB_00a9e199;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) {
LAB_00a9e1c1:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      dVar9 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      dVar11 = (double)(int)aRight;
      goto LAB_00a9e17b;
    }
    dVar9 = (double)((ulong)aLeft ^ 0xfffc000000000000);
  }
  dVar11 = (double)((ulong)aRight ^ 0xfffc000000000000);
LAB_00a9e17b:
  pvVar6 = JavascriptNumber::ToVarInPlace(dVar11 * dVar9,scriptContext,result);
  return pvVar6;
}

Assistant:

Var JavascriptMath::Multiply_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_MultiplyInPlace);

            Js::TypeId typeLeft = JavascriptOperators::GetTypeId(aLeft);
            Js::TypeId typeRight = JavascriptOperators::GetTypeId(aRight);
            if (typeLeft == TypeIds_BigInt || typeRight == TypeIds_BigInt)
            {
                if (typeRight != typeLeft)
                {
                    JavascriptError::ThrowTypeError(scriptContext, VBSERR_TypeMismatch, _u("Multiply BigInt"));
                }
                return JavascriptBigInt::Mul(aLeft, aRight);
            }

            if(JavascriptNumber::Is(aLeft))
            {
                if(JavascriptNumber::Is(aRight))
                {
                    return JavascriptNumber::ToVarInPlace(
                        JavascriptNumber::GetValue(aLeft) * JavascriptNumber::GetValue(aRight), scriptContext, result);
                }
                else if (TaggedInt::Is(aRight))
                {
                    return JavascriptNumber::ToVarInPlace(
                        JavascriptNumber::GetValue(aLeft) * TaggedInt::ToDouble(aRight), scriptContext, result);
                }
            }
            else if(JavascriptNumber::Is(aRight))
            {
                if(TaggedInt::Is(aLeft))
                {
                    return JavascriptNumber::ToVarInPlace(
                        TaggedInt::ToDouble(aLeft) * JavascriptNumber::GetValue(aRight), scriptContext, result);
                }
            }
            else if(TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::MultiplyInPlace(aLeft, aRight, scriptContext, result);
            }
            double product = Multiply_Helper(aLeft, aRight, scriptContext);
            return JavascriptNumber::InPlaceNew(product, scriptContext, result);
            JIT_HELPER_END(Op_MultiplyInPlace);
        }